

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O2

void mserialize::detail::visit_struct<binlog::ToStringVisitor,binlog::Range>
               (string_view full_tag,string_view tag,ToStringVisitor *visitor,Range *istream,
               int max_recursion)

{
  StructBegin sb;
  FieldBegin fb;
  bool bVar1;
  ulong uVar2;
  string_view sVar3;
  string_view tag_00;
  string_view local_88;
  Range *local_78;
  string_view local_70;
  string_view local_60;
  char *local_50;
  long lStack_48;
  char *local_40;
  size_t sStack_38;
  
  local_88._len = 0;
  if (tag._len != 0) {
    local_88._len = tag._len - 1;
  }
  local_88._ptr = tag._ptr;
  sVar3 = remove_prefix_before(&local_88,'`');
  if (local_88._len == 0) {
    local_88 = resolve_recursive_tag(full_tag,sVar3);
  }
  uVar2 = (ulong)(sVar3._len != 0);
  local_50 = sVar3._ptr + uVar2;
  lStack_48 = sVar3._len - uVar2;
  local_40 = local_88._ptr;
  sStack_38 = local_88._len;
  sb.name._len = lStack_48;
  sb.name._ptr = local_50;
  sb.tag._ptr = local_88._ptr;
  sb.tag._len = local_88._len;
  bVar1 = binlog::ToStringVisitor::visit(visitor,sb,istream);
  if (!bVar1) {
    local_78 = istream;
    while (local_88._len != 0) {
      sVar3 = tag_pop_label(&local_88);
      tag_00 = tag_pop(&local_88);
      local_60._ptr = tag_00._ptr;
      local_60._len = tag_00._len;
      fb.tag._ptr = local_60._ptr;
      fb.name = sVar3;
      fb.tag._len = local_60._len;
      local_70 = sVar3;
      local_60 = tag_00;
      binlog::ToStringVisitor::visit(visitor,fb);
      visit_impl<binlog::ToStringVisitor,binlog::Range>
                (full_tag,tag_00,visitor,local_78,max_recursion);
      binlog::ToStringVisitor::visit(visitor);
    }
    binlog::ToStringVisitor::visit(visitor);
  }
  return;
}

Assistant:

void visit_struct(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  tag.remove_suffix(1); // drop }

  string_view intro = remove_prefix_before(tag, '`');

  if (tag.empty())
  {
    // perhaps a recursive struct?
    tag = resolve_recursive_tag(full_tag, intro);
  }

  intro.remove_prefix(1); // drop {

  const bool skip = visitor.visit(mserialize::Visitor::StructBegin{intro, tag}, istream);
  if (skip) { return; }

  while (! tag.empty())
  {
    const string_view field_name = tag_pop_label(tag);
    const string_view field_tag = tag_pop(tag);

    visitor.visit(mserialize::Visitor::FieldBegin{field_name, field_tag});

    visit_impl(full_tag, field_tag, visitor, istream, max_recursion);

    visitor.visit(mserialize::Visitor::FieldEnd{});
  }

  visitor.visit(mserialize::Visitor::StructEnd{});
}